

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3813::ShapeFunctionsDerivativeY
          (ChElementHexaANCF_3813 *this,ShapeVector *Ny,double x,double y,double z)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [16];
  
  dVar1 = (2.0 / (this->m_InertFlexVec).m_data[1]) * 0.125;
  auVar3 = vpermi2pd_avx512f(_DAT_00ecefc0,ZEXT864((ulong)(1.0 - z)),
                             ZEXT1664(CONCAT88(z + 1.0,z + 1.0)));
  auVar4 = vbroadcasti64x4_avx512f(_DAT_00ecf300);
  auVar5._0_8_ = (1.0 - x) * dVar1;
  auVar5._8_8_ = (x + 1.0) * dVar1;
  auVar2._8_8_ = 0x8000000000000000;
  auVar2._0_8_ = 0x8000000000000000;
  auVar2 = vxorpd_avx512vl(auVar5,auVar2);
  auVar4 = vpermi2pd_avx512f(auVar4,ZEXT1664(auVar2),ZEXT1664(auVar5));
  auVar3 = vmulpd_avx512f(auVar3,auVar4);
  *(undefined1 (*) [64])
   (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array =
       auVar3;
  return;
}

Assistant:

void ChElementHexaANCF_3813::ShapeFunctionsDerivativeY(ShapeVector& Ny, double x, double y, double z) {
    double b = GetLengthY();

    Ny(0) = 2.0 / b * 0.125 * (1.0 - x) * (-1.0) * (1.0 - z);
    Ny(1) = 2.0 / b * 0.125 * (1.0 + x) * (-1.0) * (1.0 - z);
    Ny(2) = 2.0 / b * 0.125 * (1.0 + x) * (1.0) * (1.0 - z);
    Ny(3) = 2.0 / b * 0.125 * (1.0 - x) * (1.0) * (1.0 - z);
    Ny(4) = 2.0 / b * 0.125 * (1.0 - x) * (-1.0) * (1.0 + z);
    Ny(5) = 2.0 / b * 0.125 * (1.0 + x) * (-1.0) * (1.0 + z);
    Ny(6) = 2.0 / b * 0.125 * (1.0 + x) * (1.0) * (1.0 + z);
    Ny(7) = 2.0 / b * 0.125 * (1.0 - x) * (1.0) * (1.0 + z);
}